

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

string * __thiscall
dynet::PickElement::as_string
          (string *__return_storage_ptr__,PickElement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  ostringstream s;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  poVar1 = std::operator<<((ostream *)&s,"pick(");
  poVar1 = std::operator<<(poVar1,(string *)
                                  (arg_names->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
  std::operator<<(poVar1,',');
  if (this->pval == (uint *)0x0) {
    if (this->pvals == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes-common.cc"
                    ,0x281,
                    "virtual string dynet::PickElement::as_string(const vector<string> &) const");
    }
    std::operator<<((ostream *)&s,'[');
    if ((this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      for (uVar2 = 1;
          uVar2 < (ulong)((long)(this->pvals->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->pvals->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
        poVar1 = std::operator<<((ostream *)&s,',');
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      }
    }
    std::operator<<((ostream *)&s,"])");
  }
  else {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&s);
    std::operator<<(poVar1,')');
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

string PickElement::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "pick(" << arg_names[0] << ',';
  if(pval) { 
    s << *pval << ')';
  } else {
    assert(pvals);
    s << '[';
    if(pvals->size()) {
      s << (*pvals)[0];
      for(size_t i = 1; i < pvals->size(); ++i)
        s << ',' << (*pvals)[i];
    }
    s << "])";
  }
  return s.str();
}